

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Huffman.c
# Opt level: O2

int main(void)

{
  int iVar1;
  HuffmanCode *huffmanCode;
  int i;
  ulong uVar2;
  int n;
  int wei;
  HuffmanTree HT;
  
  printf("\nn =");
  __isoc99_scanf("%d",&n);
  iVar1 = n;
  huffmanCode = (HuffmanCode *)malloc((long)n * 4 + 4);
  printf("\ninput the %d element\'s weight: \n",(ulong)(uint)iVar1);
  uVar2 = 1;
  while( true ) {
    if ((long)n < (long)uVar2) break;
    printf("%d: ",uVar2 & 0xffffffff);
    fflush(_stdin);
    __isoc99_scanf("%d",&wei);
    *(int *)((long)huffmanCode + uVar2 * 4) = wei;
    uVar2 = uVar2 + 1;
  }
  createHuffmanTree(&HT,(int *)huffmanCode,n);
  creatHuffmanCode(&HT,huffmanCode,n);
  return 0;
}

Assistant:

int main(void){
    HuffmanTree HT;
    HuffmanCode HC;
    int *w,i,n,wei,m;

    printf("\nn =");

    scanf("%d",&n);

    w = (int *)malloc((n + 1) * sizeof(int));

    printf("\ninput the %d element's weight: \n",n);

    for (int i = 1; i <= n;i++) {
        printf("%d: ",i);
        fflush(stdin);
        scanf("%d",&wei);
        w[i] = wei;
    }
    createHuffmanTree(&HT,w,n);
    creatHuffmanCode(&HT,&HC,n);

    return 0;
}